

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::CoverageMaskInvertCase::drawPattern
          (CoverageMaskInvertCase *this,bool invertSampleCoverage)

{
  GLenum err;
  int i;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec3 local_a8;
  Vec3 local_98;
  Vec3 local_88;
  undefined1 local_78 [16];
  float local_68;
  float local_58;
  Vec4 local_48;
  
  iVar1 = 0;
  do {
    local_78 = ZEXT416((uint)(float)iVar1);
    glwSampleCoverage((float)iVar1 / 24.0,invertSampleCoverage);
    err = glwGetError();
    glu::checkError(err,
                    "glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x614);
    fVar4 = ((float)local_78._0_4_ * 6.2831855) / 25.0;
    fVar2 = (((float)local_78._0_4_ + 0.5) * 6.2831855) / 25.0;
    local_58 = cosf(fVar4);
    local_68 = sinf(fVar4);
    fVar4 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    fVar3 = (float)local_78._0_4_ / 25.0;
    local_48.m_data[0] = fVar3 * 0.6 + 0.4;
    local_48.m_data[1] = fVar3 * 0.3 + 0.5;
    local_48.m_data[2] = -fVar3 * 0.5 + 0.6;
    local_48.m_data[3] = -fVar3 * 0.7 + 0.7;
    local_88.m_data[0] = 0.0;
    local_88.m_data[1] = 0.0;
    local_88.m_data[2] = 0.0;
    local_98.m_data[1] = local_68 * (float)0x3f733333;
    local_98.m_data[0] = local_58 * (float)0x3f733333;
    local_98.m_data[2] = 0.0;
    local_a8.m_data[1] = fVar2 * (float)0x3f733333;
    local_a8.m_data[0] = fVar4 * (float)0x3f733333;
    local_a8.m_data[2] = 0.0;
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,&local_88,&local_98,&local_a8,&local_48,&local_48,
               &local_48);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x19);
  return;
}

Assistant:

void CoverageMaskInvertCase::drawPattern (bool invertSampleCoverage) const
{
	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		GLU_CHECK_CALL(glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE));

		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(0.4f + (float)i/(float)numTriangles*0.6f,
							0.5f + (float)i/(float)numTriangles*0.3f,
							0.6f - (float)i/(float)numTriangles*0.5f,
							0.7f - (float)i/(float)numTriangles*0.7f));
	}
}